

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68000_rol_r_16(m68k_info *info)

{
  uint8_t in_stack_0000000b;
  int in_stack_0000000c;
  m68k_info *in_stack_00000010;
  
  build_r(in_stack_00000010,in_stack_0000000c,in_stack_0000000b);
  return;
}

Assistant:

static void d68000_rol_r_16(m68k_info *info)
{
	build_r(info, M68K_INS_ROL, 2);
}